

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcOpAlg.c
# Opt level: O1

Mvc_Cover_t * Mvc_CoverAlgebraicMultiply(Mvc_Cover_t *pCover1,Mvc_Cover_t *pCover2)

{
  int *piVar1;
  Mvc_Cover_t *pCover;
  Mvc_Cube_t *pMVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  Mvc_Cube_t *pMVar6;
  Mvc_List_t *pList;
  Mvc_Cube_t *pMVar7;
  Mvc_Cube_t *pMVar8;
  bool bVar9;
  
  if (pCover1->nBits != pCover2->nBits) {
    __assert_fail("pCover1->nBits == pCover2->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcOpAlg.c"
                  ,0x32,"Mvc_Cover_t *Mvc_CoverAlgebraicMultiply(Mvc_Cover_t *, Mvc_Cover_t *)");
  }
  Mvc_CoverAllocateMask(pCover1);
  Mvc_CoverAllocateMask(pCover2);
  Mvc_CoverSupport(pCover1,pCover1->pMask);
  Mvc_CoverSupport(pCover2,pCover2->pMask);
  pMVar8 = pCover1->pMask;
  uVar3 = *(uint *)&pMVar8->field_0x8 & 0xffffff;
  if (uVar3 == 0) {
    uVar3 = pCover2->pMask->pData[0] & pMVar8->pData[0];
LAB_0040bee9:
    if (uVar3 == 0) goto LAB_0040bef9;
  }
  else {
    if (uVar3 != 1) {
      do {
        if ((pMVar8->pData[uVar3] & pCover2->pMask->pData[uVar3]) != 0) goto LAB_0040beed;
        bVar9 = 0 < (int)uVar3;
        uVar3 = uVar3 - 1;
      } while (bVar9);
      goto LAB_0040bef9;
    }
    if ((pMVar8->pData[0] & pCover2->pMask->pData[0]) == 0) {
      uVar3 = *(uint *)&pCover2->pMask->field_0x14 & *(uint *)&pMVar8->field_0x14;
      goto LAB_0040bee9;
    }
  }
LAB_0040beed:
  puts("Mvc_CoverMultiply(): Cover supports are not disjoint!");
LAB_0040bef9:
  pCover = Mvc_CoverClone(pCover1);
  pMVar8 = (pCover1->lCubes).pHead;
  if (pMVar8 != (Mvc_Cube_t *)0x0) {
    do {
      for (pMVar7 = (pCover2->lCubes).pHead; pMVar7 != (Mvc_Cube_t *)0x0; pMVar7 = pMVar7->pNext) {
        pMVar2 = Mvc_CubeAlloc(pCover);
        uVar3 = *(uint *)&pMVar8->field_0x8 & 0xffffff;
        if (uVar3 == 0) {
          pMVar2->pData[0] = pMVar7->pData[0] | pMVar8->pData[0];
        }
        else if (uVar3 == 1) {
          pMVar2->pData[0] = pMVar7->pData[0] | pMVar8->pData[0];
          *(uint *)&pMVar2->field_0x14 = *(uint *)&pMVar7->field_0x14 | *(uint *)&pMVar8->field_0x14
          ;
        }
        else {
          lVar4 = (ulong)(*(uint *)&pMVar8->field_0x8 & 0xffffff) + 4;
          do {
            pMVar2->pData[lVar4 + -4] = pMVar7->pData[lVar4 + -4] | pMVar8->pData[lVar4 + -4];
            lVar5 = lVar4 + -4;
            bVar9 = lVar4 != 4;
            lVar4 = lVar4 + -1;
          } while (bVar9 && -1 < lVar5);
        }
        pMVar6 = (Mvc_Cube_t *)&pCover->lCubes;
        if ((pCover->lCubes).pHead != (Mvc_Cube_t *)0x0) {
          pMVar6 = (pCover->lCubes).pTail;
        }
        pMVar6->pNext = pMVar2;
        (pCover->lCubes).pTail = pMVar2;
        pMVar2->pNext = (Mvc_Cube_t *)0x0;
        piVar1 = &(pCover->lCubes).nItems;
        *piVar1 = *piVar1 + 1;
      }
      pMVar8 = pMVar8->pNext;
    } while (pMVar8 != (Mvc_Cube_t *)0x0);
  }
  return pCover;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Multiplies two disjoint-support covers.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mvc_Cover_t * Mvc_CoverAlgebraicMultiply( Mvc_Cover_t * pCover1, Mvc_Cover_t * pCover2 )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube1, * pCube2, * pCube;
    int CompResult;

    // covers should be the same base
    assert( pCover1->nBits == pCover2->nBits );
    // make sure that supports do not overlap
    Mvc_CoverAllocateMask( pCover1 );
    Mvc_CoverAllocateMask( pCover2 );
    Mvc_CoverSupport( pCover1, pCover1->pMask );
    Mvc_CoverSupport( pCover2, pCover2->pMask );
    // check if the cubes are bit-wise disjoint
    Mvc_CubeBitDisjoint( CompResult, pCover1->pMask, pCover2->pMask );
    if ( !CompResult )
        printf( "Mvc_CoverMultiply(): Cover supports are not disjoint!\n" );

    // iterate through the cubes
    pCover = Mvc_CoverClone( pCover1 );
    Mvc_CoverForEachCube( pCover1, pCube1 )
        Mvc_CoverForEachCube( pCover2, pCube2 )
        { 
            // create the product cube
            pCube = Mvc_CubeAlloc( pCover );
            // set the product cube equal to the product of the two cubes
            Mvc_CubeBitOr( pCube, pCube1, pCube2 );
            // add the cube to the cover
            Mvc_CoverAddCubeTail( pCover, pCube );
        }
    return pCover;
}